

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O2

void __thiscall
chrono::ChVisualShapeFEA::UpdateBuffers_Hex
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChElementBase> *element,
          ChTriangleMeshConnected *trianglemesh,uint *i_verts,uint *i_vnorms,uint *i_vcols,
          uint *i_triindex)

{
  pointer pCVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  element_type *peVar5;
  pointer pCVar6;
  pointer pCVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  long lVar11;
  ChVisualShapeFEA *pCVar12;
  int nodeID;
  int iVar13;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 local_1e8 [32];
  double local_1c8;
  uint *local_1c0;
  double local_1b8;
  uint *local_1b0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2> local_198;
  double local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  ChVector<double> pt [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> nodes [8];
  
  local_1b8 = (double)(ulong)*i_verts;
  this_00 = &nodes[0].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>;
  pdVar20 = pt[0].m_data + 2;
  local_1c8 = (double)(ulong)*i_vnorms;
  nodes[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[0].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[0].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nodes[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodes[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pt[5].m_data[1] = 0.0;
  pt[5].m_data[2] = 0.0;
  pt[6].m_data[0] = 0.0;
  pt[6].m_data[1] = 0.0;
  pt[6].m_data[2] = 0.0;
  pt[7].m_data[0] = 0.0;
  pt[7].m_data[1] = 0.0;
  pt[7].m_data[2] = 0.0;
  pt[2].m_data[2] = 0.0;
  pt[3].m_data[0] = 0.0;
  pt[3].m_data[1] = 0.0;
  pt[3].m_data[2] = 0.0;
  pt[4].m_data[0] = 0.0;
  pt[4].m_data[1] = 0.0;
  pt[4].m_data[2] = 0.0;
  pt[5].m_data[0] = 0.0;
  pt[0].m_data[0] = 0.0;
  pt[0].m_data[1] = 0.0;
  pt[0].m_data[2] = 0.0;
  pt[1].m_data[0] = 0.0;
  pt[1].m_data[1] = 0.0;
  pt[1].m_data[2] = 0.0;
  pt[2].m_data[0] = 0.0;
  pt[2].m_data[1] = 0.0;
  local_1c0 = i_vnorms;
  local_1b0 = i_verts;
  for (uVar21 = 0; uVar21 != 8; uVar21 = uVar21 + 1) {
    peVar4 = (element->super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*peVar4->_vptr_ChElementBase[5])(&local_188,peVar4,uVar21 & 0xffffffff);
    std::static_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>
              ((shared_ptr<chrono::fea::ChNodeFEAbase> *)local_1e8);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                       local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
    if (this->undeformed_reference == false) {
      peVar5 = this_00->_M_ptr;
      dVar23 = *(double *)&peVar5->field_0x28;
      ((ChVector<double> *)(pdVar20 + -2))->m_data[0] =
           *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20;
      pdVar20[-1] = dVar23;
      dVar23 = *(double *)&peVar5->field_0x30;
    }
    else {
      (*(this_00->_M_ptr->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0xc])
                ((ChVisualShapeFEA *)local_1e8);
      ((ChVector<double> *)(pdVar20 + -2))->m_data[0] = (double)local_1e8._0_8_;
      pdVar20[-1] = (double)CONCAT44(local_1e8._12_4_,local_1e8._8_4_);
      dVar23 = (double)local_1e8._16_8_;
    }
    *pdVar20 = dVar23;
    pdVar20 = pdVar20 + 3;
    this_00 = this_00 + 1;
  }
  if (this->shrink_elements == true) {
    auVar22 = ZEXT816(0) << 0x40;
    dVar23 = 0.0;
    for (lVar11 = 0x10; lVar11 != 0xd0; lVar11 = lVar11 + 0x18) {
      dVar2 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + *(double *)((long)&local_188 + lVar11);
      auVar22._8_8_ = dVar2 + *(double *)((long)&local_180._M_pi + lVar11);
      dVar23 = dVar23 + *(double *)((long)pt[0].m_data + lVar11);
    }
    auVar8._8_8_ = 0x3fc0000000000000;
    auVar8._0_8_ = 0x3fc0000000000000;
    auVar22 = vmulpd_avx512vl(auVar22,auVar8);
    dVar2 = this->shrink_factor;
    for (lVar11 = 0x10; lVar11 != 0xd0; lVar11 = lVar11 + 0x18) {
      dVar3 = *(double *)((long)pt[0].m_data + lVar11);
      auVar8 = vsubpd_avx(*(undefined1 (*) [16])((long)&local_188 + lVar11),auVar22);
      *(double *)((long)&local_188 + lVar11) = auVar22._0_8_ + dVar2 * auVar8._0_8_;
      *(double *)((long)&local_180._M_pi + lVar11) = auVar22._8_8_ + dVar2 * auVar8._8_8_;
      *(double *)((long)pt[0].m_data + lVar11) = dVar23 * 0.125 + (dVar3 - dVar23 * 0.125) * dVar2;
    }
  }
  pCVar6 = (trianglemesh->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar14 = *local_1b0;
  for (lVar11 = 0x10; lVar11 != 0xd0; lVar11 = lVar11 + 0x18) {
    dVar23 = *(double *)((long)&local_180._M_pi + lVar11);
    pCVar1 = pCVar6 + uVar14;
    pCVar1->m_data[0] = *(double *)((long)&local_188 + lVar11);
    pCVar1->m_data[1] = dVar23;
    pCVar6[uVar14].m_data[2] = *(double *)((long)pt[0].m_data + lVar11);
    uVar14 = uVar14 + 1;
  }
  *local_1b0 = uVar14;
  for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x10) {
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&nodes[0].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar11));
    std::__shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_198,
               &element->super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>)
    ;
    dVar23 = ComputeScalarOutput(this,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_1a8,nodeID,
                                 (shared_ptr<chrono::fea::ChElementBase> *)&local_198);
    ComputeFalseColor((ChVisualShapeFEA *)local_1e8,dVar23);
    pCVar12 = (ChVisualShapeFEA *)
              ((trianglemesh->m_colors).
               super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
               super__Vector_impl_data._M_start + *i_vcols);
    if ((ChVisualShapeFEA *)local_1e8 != pCVar12) {
      (pCVar12->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_1e8._0_8_;
      *(undefined4 *)
       &(pCVar12->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_1e8._8_4_;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    *i_vcols = *i_vcols + 1;
  }
  uVar14 = *i_triindex;
  pCVar7 = (trianglemesh->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar9 = SUB84(local_1b8,0);
  iVar10 = iVar9 + 2;
  iVar13 = iVar9 + 1;
  iVar17 = iVar9 + 3;
  iVar19 = iVar9 + 4;
  iVar16 = iVar9 + 6;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar10;
  pCVar7[uVar14].m_data[2] = iVar13;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar17;
  pCVar7[uVar14].m_data[2] = iVar10;
  iVar15 = iVar9 + 5;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar19;
  pCVar7[uVar14].m_data[1] = iVar15;
  pCVar7[uVar14].m_data[2] = iVar16;
  iVar18 = iVar9 + 7;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar19;
  pCVar7[uVar14].m_data[1] = iVar16;
  pCVar7[uVar14].m_data[2] = iVar18;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar18;
  pCVar7[uVar14].m_data[2] = iVar17;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar19;
  pCVar7[uVar14].m_data[2] = iVar18;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar15;
  pCVar7[uVar14].m_data[2] = iVar19;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar9;
  pCVar7[uVar14].m_data[1] = iVar13;
  pCVar7[uVar14].m_data[2] = iVar15;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar17;
  pCVar7[uVar14].m_data[1] = iVar18;
  pCVar7[uVar14].m_data[2] = iVar16;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar17;
  pCVar7[uVar14].m_data[1] = iVar16;
  pCVar7[uVar14].m_data[2] = iVar10;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar10;
  pCVar7[uVar14].m_data[1] = iVar15;
  pCVar7[uVar14].m_data[2] = iVar13;
  uVar14 = *i_triindex + 1;
  *i_triindex = uVar14;
  pCVar7[uVar14].m_data[0] = iVar10;
  pCVar7[uVar14].m_data[1] = iVar16;
  pCVar7[uVar14].m_data[2] = iVar15;
  uVar14 = *i_triindex;
  *i_triindex = uVar14 + 1;
  if (this->smooth_faces == true) {
    pCVar7 = (trianglemesh->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar14 = uVar14 - 0xb;
    iVar9 = SUB84(local_1c8,0);
    pCVar7[uVar14].m_data[0] = iVar9;
    pCVar7[uVar14].m_data[1] = iVar9 + 2;
    pCVar7[uVar14].m_data[2] = iVar9 + 1;
    uVar14 = *i_triindex - 0xb;
    pCVar7[uVar14].m_data[0] = iVar9;
    pCVar7[uVar14].m_data[1] = iVar9 + 3;
    pCVar7[uVar14].m_data[2] = iVar9 + 2;
    uVar14 = *i_triindex - 10;
    pCVar7[uVar14].m_data[0] = iVar9 + 4;
    pCVar7[uVar14].m_data[1] = iVar9 + 5;
    pCVar7[uVar14].m_data[2] = iVar9 + 6;
    uVar14 = *i_triindex - 9;
    pCVar7[uVar14].m_data[0] = iVar9 + 4;
    pCVar7[uVar14].m_data[1] = iVar9 + 6;
    pCVar7[uVar14].m_data[2] = iVar9 + 7;
    uVar14 = *i_triindex - 8;
    pCVar7[uVar14].m_data[0] = iVar9 + 8;
    pCVar7[uVar14].m_data[1] = iVar9 + 9;
    pCVar7[uVar14].m_data[2] = iVar9 + 10;
    uVar14 = *i_triindex - 7;
    pCVar7[uVar14].m_data[0] = iVar9 + 8;
    pCVar7[uVar14].m_data[1] = iVar9 + 0xb;
    pCVar7[uVar14].m_data[2] = iVar9 + 9;
    uVar14 = *i_triindex - 6;
    pCVar7[uVar14].m_data[0] = iVar9 + 0xc;
    pCVar7[uVar14].m_data[1] = iVar9 + 0xd;
    pCVar7[uVar14].m_data[2] = iVar9 + 0xe;
    uVar14 = *i_triindex - 5;
    pCVar7[uVar14].m_data[0] = iVar9 + 0xc;
    pCVar7[uVar14].m_data[1] = iVar9 + 0xf;
    pCVar7[uVar14].m_data[2] = iVar9 + 0xd;
    uVar14 = *i_triindex - 4;
    pCVar7[uVar14].m_data[0] = iVar9 + 0x10;
    pCVar7[uVar14].m_data[1] = iVar9 + 0x12;
    pCVar7[uVar14].m_data[2] = iVar9 + 0x11;
    uVar14 = *i_triindex - 3;
    pCVar7[uVar14].m_data[0] = iVar9 + 0x10;
    pCVar7[uVar14].m_data[1] = iVar9 + 0x11;
    pCVar7[uVar14].m_data[2] = iVar9 + 0x13;
    uVar14 = *i_triindex - 2;
    pCVar7[uVar14].m_data[0] = iVar9 + 0x14;
    pCVar7[uVar14].m_data[1] = iVar9 + 0x15;
    pCVar7[uVar14].m_data[2] = iVar9 + 0x17;
    uVar14 = *i_triindex - 1;
    pCVar7[uVar14].m_data[0] = iVar9 + 0x14;
    pCVar7[uVar14].m_data[1] = iVar9 + 0x16;
    pCVar7[uVar14].m_data[2] = iVar9 + 0x15;
    *local_1c0 = *local_1c0 + 0x18;
  }
  lVar11 = 0x78;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&nodes[0].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -8);
  return;
}

Assistant:

void ChVisualShapeFEA::UpdateBuffers_Hex(std::shared_ptr<ChElementBase> element,
                                         geometry::ChTriangleMeshConnected& trianglemesh,
                                         unsigned int& i_verts,
                                         unsigned int& i_vnorms,
                                         unsigned int& i_vcols,
                                         unsigned int& i_triindex) {
    unsigned int ivert_el = i_verts;
    unsigned int inorm_el = i_vnorms;

    std::shared_ptr<ChNodeFEAxyz> nodes[8];
    ChVector<> pt[8];

    for (int in = 0; in < 8; ++in) {
        nodes[in] = std::static_pointer_cast<ChNodeFEAxyz>(element->GetNodeN(in));
        if (!undeformed_reference)
            pt[in] = nodes[in]->GetPos();
        else
            pt[in] = nodes[in]->GetX0();
    }

    // vertexes

    if (shrink_elements) {
        ChVector<> vc(0, 0, 0);
        for (int in = 0; in < 8; ++in)
            vc += pt[in];
        vc = vc * (1.0 / 8.0);  // average, center of element
        for (int in = 0; in < 8; ++in)
            pt[in] = vc + shrink_factor * (pt[in] - vc);
    }

    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsVertices()[i_verts] = pt[in];
        ++i_verts;
    }

    // colours and colours indexes
    for (int in = 0; in < 8; ++in) {
        trianglemesh.getCoordsColors()[i_vcols] = ComputeFalseColor(ComputeScalarOutput(nodes[in], in, element));
        ++i_vcols;
    }

    // faces indexes
    ChVector<int> ivert_offset(ivert_el, ivert_el, ivert_el);
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 2, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 3, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 5, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(4, 6, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 7, 3) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 4, 7) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 5, 4) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(0, 1, 5) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 7, 6) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(3, 6, 2) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 5, 1) + ivert_offset;
    ++i_triindex;
    trianglemesh.getIndicesVertexes()[i_triindex] = ChVector<int>(2, 6, 5) + ivert_offset;
    ++i_triindex;

    // normals indices (if not defaulting to flat triangles)
    if (smooth_faces) {
        ChVector<int> inorm_offset = ChVector<int>(inorm_el, inorm_el, inorm_el);
        trianglemesh.getIndicesNormals()[i_triindex - 12] = ChVector<int>(0, 2, 1) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 11] = ChVector<int>(0, 3, 2) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 10] = ChVector<int>(4, 5, 6) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 9] = ChVector<int>(4, 6, 7) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 8] = ChVector<int>(8, 9, 10) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 7] = ChVector<int>(8, 11, 9) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 6] = ChVector<int>(12, 13, 14) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 5] = ChVector<int>(12, 15, 13) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 4] = ChVector<int>(16, 18, 17) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 3] = ChVector<int>(16, 17, 19) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 2] = ChVector<int>(20, 21, 23) + inorm_offset;
        trianglemesh.getIndicesNormals()[i_triindex - 1] = ChVector<int>(20, 22, 21) + inorm_offset;
        i_vnorms += 24;
    }
}